

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fir1.cpp
# Opt level: O0

void __thiscall Fir1::setCoeff(Fir1 *this,double *coeff_data,uint number_of_taps)

{
  runtime_error *this_00;
  uint in_EDX;
  long in_RSI;
  long *in_RDI;
  uint i;
  uint local_28;
  
  if (in_EDX != *(uint *)(in_RDI + 2)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Invalid number of taps in new coefficient array");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  for (local_28 = 0; local_28 < in_EDX; local_28 = local_28 + 1) {
    *(undefined8 *)(*in_RDI + (ulong)local_28 * 8) = *(undefined8 *)(in_RSI + (ulong)local_28 * 8);
  }
  return;
}

Assistant:

void Fir1::setCoeff(const double* coeff_data, const unsigned number_of_taps) {

	if (number_of_taps != taps) {
		throw std::runtime_error("Invalid number of taps in new coefficient array");
	}
	for (unsigned int i = 0; i < number_of_taps; i++) {
		coefficients[i] = coeff_data[i];
	}
}